

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O1

SVInt __thiscall
slang::ast::UnbasedUnsizedIntegerLiteral::getValue(UnbasedUnsizedIntegerLiteral *this)

{
  byte bVar1;
  bool isSigned;
  bitwidth_t bitWidth;
  logic_error *this_00;
  long *plVar2;
  size_type *psVar3;
  long *plVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  long in_RSI;
  SVInt SVar6;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined8 uVar5;
  
  if (*(Type **)(in_RSI + 8) != (Type *)0x0) {
    bitWidth = Type::getBitWidth(*(Type **)(in_RSI + 8));
    if (*(Type **)(in_RSI + 8) != (Type *)0x0) {
      isSigned = Type::isSigned(*(Type **)(in_RSI + 8));
      bVar1 = *(byte *)(in_RSI + 0x30);
      if (bVar1 < 0x40) {
        if (bVar1 == 0) {
          SVInt::SVInt((SVInt *)this,bitWidth,0,isSigned);
          uVar5 = extraout_RDX_00;
        }
        else {
          if (bVar1 != 1) {
LAB_0039fa3d:
            this_00 = (logic_error *)__cxa_allocate_exception(0x10);
            local_90[0] = local_80;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_90,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/LiteralExpressions.cpp"
                       ,"");
            plVar2 = (long *)std::__cxx11::string::append((char *)local_90);
            local_d0._M_dataplus._M_p = (pointer)*plVar2;
            psVar3 = (size_type *)(plVar2 + 2);
            if ((size_type *)local_d0._M_dataplus._M_p == psVar3) {
              local_d0.field_2._M_allocated_capacity = *psVar3;
              local_d0.field_2._8_8_ = plVar2[3];
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            }
            else {
              local_d0.field_2._M_allocated_capacity = *psVar3;
            }
            local_d0._M_string_length = plVar2[1];
            *plVar2 = (long)psVar3;
            plVar2[1] = 0;
            *(undefined1 *)(plVar2 + 2) = 0;
            std::__cxx11::to_string(&local_70,0xa8);
            std::operator+(&local_50,&local_d0,&local_70);
            plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
            local_b0 = (long *)*plVar2;
            plVar4 = plVar2 + 2;
            if (local_b0 == plVar4) {
              local_a0 = *plVar4;
              lStack_98 = plVar2[3];
              local_b0 = &local_a0;
            }
            else {
              local_a0 = *plVar4;
            }
            local_a8 = plVar2[1];
            *plVar2 = (long)plVar4;
            plVar2[1] = 0;
            *(undefined1 *)(plVar2 + 2) = 0;
            plVar2 = (long *)std::__cxx11::string::append((char *)&local_b0);
            local_f0 = (long *)*plVar2;
            plVar4 = plVar2 + 2;
            if (local_f0 == plVar4) {
              local_e0 = *plVar4;
              lStack_d8 = plVar2[3];
              local_f0 = &local_e0;
            }
            else {
              local_e0 = *plVar4;
            }
            local_e8 = plVar2[1];
            *plVar2 = (long)plVar4;
            plVar2[1] = 0;
            *(undefined1 *)(plVar2 + 2) = 0;
            std::logic_error::logic_error(this_00,(string *)&local_f0);
            __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          SVInt::SVInt((SVInt *)this,bitWidth,0,isSigned);
          SVInt::setAllOnes((SVInt *)this);
          uVar5 = extraout_RDX;
        }
      }
      else if (bVar1 == 0x40) {
        SVar6 = SVInt::createFillZ((SVInt *)this,bitWidth,isSigned);
        uVar5 = SVar6.super_SVIntStorage._8_8_;
      }
      else {
        if (bVar1 != 0x80) goto LAB_0039fa3d;
        SVar6 = SVInt::createFillX((SVInt *)this,bitWidth,isSigned);
        uVar5 = SVar6.super_SVIntStorage._8_8_;
      }
      SVar6.super_SVIntStorage.bitWidth = (int)uVar5;
      SVar6.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar5 >> 0x20);
      SVar6.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar5 >> 0x28);
      SVar6.super_SVIntStorage._14_2_ = (short)((ulong)uVar5 >> 0x30);
      SVar6.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
      return (SVInt)SVar6.super_SVIntStorage;
    }
  }
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,
             "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
            );
}

Assistant:

SVInt UnbasedUnsizedIntegerLiteral::getValue() const {
    bitwidth_t width = type->getBitWidth();
    bool isSigned = type->isSigned();

    switch (value.value) {
        case 0:
            return SVInt(width, 0, isSigned);
        case 1: {
            SVInt tmp(width, 0, isSigned);
            tmp.setAllOnes();
            return tmp;
        }
        case logic_t::X_VALUE:
            return SVInt::createFillX(width, isSigned);
        case logic_t::Z_VALUE:
            return SVInt::createFillZ(width, isSigned);
        default:
            ASSUME_UNREACHABLE;
    }
}